

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

void __thiscall rtosc::Ports::dispatch(Ports *this,char *m,RtData *d,bool base_dispatch)

{
  char *pcVar1;
  int i;
  Port_Matcher *pPVar2;
  int *piVar3;
  Port *pPVar4;
  pointer piVar5;
  pointer pPVar6;
  pointer pbVar7;
  bool bVar8;
  _Bool _Var9;
  iterator __begin3;
  int *piVar10;
  char *pcVar11;
  undefined7 in_register_00000009;
  char cVar12;
  int iVar13;
  long lVar14;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range2;
  ulong uVar15;
  Port *port;
  Port *pPVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  char *m_end;
  char *local_60;
  void *local_58;
  char *local_50;
  char *local_48;
  Ports *local_40;
  char *local_38;
  
  local_58 = d->obj;
  if ((int)CONCAT71(in_register_00000009,base_dispatch) != 0) {
    d->matches = 0;
    d->message = m;
    if (m == (char *)0x0) {
      m = (char *)0x0;
    }
    else {
      m = m + (*m == '/');
    }
    if (d->loc != (char *)0x0) {
      *d->loc = '\0';
    }
  }
  pcVar19 = d->loc;
  if ((pcVar19 == (char *)0x0) || (d->loc_size == 0)) {
    pPVar16 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar4 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar16 != pPVar4) {
      do {
        _Var9 = rtosc_match(pPVar16->name,m,(char **)0x0);
        if (_Var9) {
          d->port = pPVar16;
          if ((pPVar16->cb).super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_00105c9b;
          local_60 = m;
          (*(pPVar16->cb)._M_invoker)((_Any_data *)&pPVar16->cb,&local_60,d);
          d->obj = local_58;
        }
        pPVar16 = pPVar16 + 1;
      } while (pPVar16 != pPVar4);
    }
  }
  else {
    if (*pcVar19 == '\0') {
      memset(pcVar19,0,d->loc_size);
      *d->loc = '/';
      pcVar19 = d->loc;
    }
    pcVar19 = pcVar19 + -1;
    do {
      pcVar11 = pcVar19;
      pcVar19 = pcVar11 + 1;
    } while (pcVar11[1] != '\0');
    pPVar2 = this->impl;
    piVar10 = (pPVar2->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar3 = (pPVar2->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar10 == piVar3) {
      if (this->elms != 0) {
        local_48 = pcVar11 + 2;
        local_50 = m + 1;
        uVar17 = 0;
        local_40 = this;
        do {
          pPVar6 = (local_40->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          _Var9 = rtosc_match(pPVar6[uVar17].name,m,&local_38);
          if (_Var9) {
            pPVar16 = pPVar6 + uVar17;
            if (pPVar16->ports == (Ports *)0x0) {
              d->matches = d->matches + 1;
            }
            pcVar11 = pPVar16->name;
            pcVar18 = strchr(pcVar11,0x23);
            if (pcVar18 == (char *)0x0) {
              pcVar18 = d->loc + -1;
              do {
                pcVar1 = pcVar18 + 1;
                pcVar18 = pcVar18 + 1;
              } while (*pcVar1 != '\0');
              for (lVar14 = 0; (cVar12 = pcVar11[lVar14], cVar12 != '\0' && (cVar12 != ':'));
                  lVar14 = lVar14 + 1) {
                pcVar18[lVar14] = cVar12;
              }
              pcVar18 = pcVar18 + lVar14;
            }
            else {
              cVar12 = *m;
              pcVar18 = pcVar19;
              pcVar11 = local_50;
              if (m != local_38 && cVar12 != '\0') {
                do {
                  *pcVar18 = cVar12;
                  pcVar18 = pcVar18 + 1;
                  cVar12 = *pcVar11;
                  if (cVar12 == '\0') break;
                  bVar8 = pcVar11 != local_38;
                  pcVar11 = pcVar11 + 1;
                } while (bVar8);
              }
            }
            *pcVar18 = '\0';
            d->port = pPVar16;
            if ((pPVar16->cb).super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_00105c9b;
            local_60 = m;
            (*(pPVar16->cb)._M_invoker)((_Any_data *)&pPVar16->cb,&local_60,d);
            d->obj = local_58;
            cVar12 = *pcVar19;
            pcVar11 = local_48;
            while (cVar12 != '\0') {
              pcVar11[-1] = '\0';
              cVar12 = *pcVar11;
              pcVar11 = pcVar11 + 1;
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < local_40->elms);
      }
    }
    else {
      for (lVar14 = 0; (cVar12 = m[lVar14], cVar12 != '\0' && (cVar12 != '/')); lVar14 = lVar14 + 1)
      {
      }
      uVar15 = (ulong)(cVar12 == '/') + lVar14;
      uVar17 = uVar15 & 0xffffffff;
      do {
        if (*piVar10 < (int)uVar15) {
          uVar17 = (ulong)(uint)((int)uVar17 +
                                (pPVar2->assoc).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[m[*piVar10]]);
        }
        piVar10 = piVar10 + 1;
      } while (piVar10 != piVar3);
      piVar5 = (pPVar2->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar13 = (int)uVar17;
      if (iVar13 < (int)((ulong)((long)(pPVar2->remap).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >>
                        2)) {
        i = piVar5[iVar13];
        bVar8 = Port_Matcher::hard_match(pPVar2,i,m);
        if (bVar8) {
          pPVar6 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pPVar2 = this->impl;
          iVar13 = (pPVar2->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar13];
          if (pPVar6[iVar13].ports == (Ports *)0x0) {
            d->matches = d->matches + 1;
          }
          pPVar16 = pPVar6 + iVar13;
          pcVar11 = m;
          pcVar18 = pcVar19;
          if (pPVar2->m_enump[i] == true) {
            for (; (cVar12 = *pcVar11, cVar12 != '\0' && (cVar12 != '/')); pcVar11 = pcVar11 + 1) {
              *pcVar18 = cVar12;
              pcVar18 = pcVar18 + 1;
            }
            pcVar11 = strchr(pPVar16->name,0x2f);
            if (pcVar11 != (char *)0x0) {
              *pcVar18 = '/';
              pcVar18 = pcVar18 + 1;
            }
            *pcVar18 = '\0';
          }
          else {
            pbVar7 = (pPVar2->fixed).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            memcpy(pcVar19,pbVar7[i]._M_dataplus._M_p,pbVar7[i]._M_string_length + 1);
          }
          d->port = pPVar16;
          if ((pPVar16->cb).super__Function_base._M_manager != (_Manager_type)0x0) {
            local_60 = m;
            (*(pPVar16->cb)._M_invoker)((_Any_data *)&pPVar16->cb,&local_60,d);
            d->obj = local_58;
            *pcVar19 = '\0';
            return;
          }
LAB_00105c9b:
          local_60 = m;
          std::__throw_bad_function_call();
        }
        if ((this->default_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
          return;
        }
        d->matches = d->matches + 1;
        local_60 = m;
        (*(this->default_handler)._M_invoker)((_Any_data *)&this->default_handler,&local_60,d);
      }
      else {
        if ((this->default_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
          return;
        }
        d->matches = d->matches + 1;
        local_60 = m;
        (*(this->default_handler)._M_invoker)((_Any_data *)&this->default_handler,&local_60,d);
      }
      d->obj = local_58;
    }
  }
  return;
}

Assistant:

void Ports::dispatch(const char *m, rtosc::RtData &d, bool base_dispatch) const
{
    // rRecur*Cb have already set d.loc to the required pointer
    // in case no port will match, d.loc will not be touched
    // this enables returning the address of a runtime object

    void *obj = d.obj;

    //handle the first dispatch layer
    if(base_dispatch) {
        d.matches = 0;
        d.message = m;
        if(m && *m == '/')
            m++;
        if(d.loc)
            d.loc[0] = 0;
    }

    //simple case
    if(!d.loc || !d.loc_size) {
        for(const Port &port: ports) {
            if(rtosc_match(port.name,m, NULL))
                d.port = &port, port.cb(m,d), d.obj = obj;
        }
    } else {

        //TODO this function is certainly buggy at the moment, some tests
        //are needed to make it clean
        //XXX buffer_size is not properly handled yet
        if(__builtin_expect(d.loc[0] == 0, 0)) {
            memset(d.loc, 0, d.loc_size);
            d.loc[0] = '/';
        }

        char *old_end = d.loc;
        while(*old_end) ++old_end;

        if(impl->pos.empty()) { //No perfect minimal hash function
            for(unsigned i=0; i<elms; ++i) {
                const Port &port = ports[i];
                const char* m_end;
                if(!rtosc_match(port.name, m, &m_end))
                    continue;
                if(!port.ports)
                    d.matches++;

                //Append the path
                if(strchr(port.name,'#')) {
                    const char *msg = m;
                    char       *pos = old_end;
                    while(*msg && msg != m_end)
                        *pos++ = *msg++;
                    *pos = '\0';
                } else
                    scat(d.loc, port.name);

                d.port = &port;

                //Apply callback
                port.cb(m,d), d.obj = obj;

                //Remove the rest of the path
                char *tmp = old_end;
                while(*tmp) *tmp++=0;
            }
        } else {

            //Define string to be hashed
            unsigned len=0;
            const char *tmp = m;

            while(*tmp && *tmp != '/')
                tmp++;
            if(*tmp == '/')
                tmp++;
            len = tmp-m;

            //Compute the hash
            int t = len;
            for(auto p:impl->pos)
                if(p < (int)len)
                    t += impl->assoc[m[p]];
            if(t >= (int)impl->remap.size() && !default_handler)
                return;
            else if(t >= (int)impl->remap.size() && default_handler) {
                d.matches++;
                default_handler(m,d), d.obj = obj;
                return;
            }

            int port_num = impl->remap[t];

            //Verify the chosen port is correct
            if(__builtin_expect(impl->hard_match(port_num, m), 1)) {
                const Port &port = ports[impl->remap[t]];
                if(!port.ports)
                    d.matches++;

                //Append the path
                if(impl->enump()[port_num]) {
                    const char *msg = m;
                    char       *pos = old_end;
                    while(*msg && *msg != '/')
                        *pos++ = *msg++;
                    if(strchr(port.name, '/'))
                        *pos++ = '/';
                    *pos = '\0';
                } else
                    memcpy(old_end, impl->fixed[port_num].c_str(),
                            impl->fixed[port_num].length()+1);

                d.port = &port;

                //Apply callback
                port.cb(m,d), d.obj = obj;

                //Remove the rest of the path
                old_end[0] = '\0';
            } else if(default_handler) {
                d.matches++;
                default_handler(m,d), d.obj = obj;
            }
        }
    }
}